

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

bool __thiscall JFSON::anon_unknown_21::JsonParser::consume_comment(JsonParser *this)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  JsonParser *pJStack_18;
  bool comment_found;
  JsonParser *this_local;
  
  local_19 = 0;
  pJStack_18 = this;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this->str);
  if (*pcVar3 == '/') {
    this->i = this->i + 1;
    sVar1 = this->i;
    sVar4 = std::__cxx11::string::size();
    if (sVar1 == sVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_40,"unexpected end of input after start of comment",&local_41);
      this_local._7_1_ = fail<bool>(this,(string *)local_40,false);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      goto LAB_001087fc;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this->str);
    if (*pcVar3 != '/') {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this->str);
      if (*pcVar3 == '*') {
        this->i = this->i + 1;
        uVar2 = this->i;
        lVar6 = std::__cxx11::string::size();
        if (lVar6 - 2U < uVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_78,"unexpected end of input inside multi-line comment",&local_79);
          this_local._7_1_ = fail<bool>(this,(string *)local_78,false);
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        else {
          do {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this->str);
            bVar7 = false;
            if (*pcVar3 == '*') {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this->str);
              bVar7 = *pcVar3 == '/';
            }
            if (bVar7) {
              this->i = this->i + 2;
              goto LAB_001087f2;
            }
            this->i = this->i + 1;
            uVar2 = this->i;
            lVar6 = std::__cxx11::string::size();
          } while (uVar2 <= lVar6 - 2U);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_a0,"unexpected end of input inside multi-line comment",&local_a1);
          this_local._7_1_ = fail<bool>(this,(string *)local_a0,false);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"malformed comment",&local_c9);
        this_local._7_1_ = fail<bool>(this,(string *)local_c8,false);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
      goto LAB_001087fc;
    }
    this->i = this->i + 1;
    while( true ) {
      uVar2 = this->i;
      uVar5 = std::__cxx11::string::size();
      bVar7 = false;
      if (uVar2 < uVar5) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this->str);
        bVar7 = *pcVar3 != '\n';
      }
      if (!bVar7) break;
      this->i = this->i + 1;
    }
LAB_001087f2:
    local_19 = 1;
  }
  this_local._7_1_ = local_19 & 1;
LAB_001087fc:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool consume_comment() {
      bool comment_found = false;
      if (str[i] == '/') {
        i++;
        if (i == str.size())
          return fail("unexpected end of input after start of comment", false);
        if (str[i] == '/') { // inline comment
          i++;
          // advance until next line, or end of input
          while (i < str.size() && str[i] != '\n') {
            i++;
          }
          comment_found = true;
        }
        else if (str[i] == '*') { // multiline comment
          i++;
          if (i > str.size()-2)
            return fail("unexpected end of input inside multi-line comment", false);
          // advance until closing tokens
          while (!(str[i] == '*' && str[i+1] == '/')) {
            i++;
            if (i > str.size()-2)
              return fail(
                "unexpected end of input inside multi-line comment", false);
          }
          i += 2;
          comment_found = true;
        }
        else
          return fail("malformed comment", false);
      }
      return comment_found;
    }